

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

void __thiscall tcmalloc::PageHeap::IncrementalScavenge(PageHeap *this,Length n)

{
  double dVar1;
  Length LVar2;
  undefined1 auVar3 [16];
  double local_38;
  double wait;
  double mult;
  Length released_pages;
  double rate;
  Length n_local;
  PageHeap *this_local;
  
  this->scavenge_counter_ = this->scavenge_counter_ - n;
  dVar1 = FLAG__namespace_do_not_use_directly_use_DECLARE_double_instead::
          FLAGS_tcmalloc_release_rate;
  if (this->scavenge_counter_ < 0) {
    if (1e-06 < FLAG__namespace_do_not_use_directly_use_DECLARE_double_instead::
                FLAGS_tcmalloc_release_rate) {
      (this->stats_).scavenge_count = (this->stats_).scavenge_count + 1;
      LVar2 = ReleaseAtLeastNPages(this,1);
      if (LVar2 == 0) {
        this->scavenge_counter_ = 0x40000;
      }
      else {
        auVar3._8_4_ = (int)(LVar2 >> 0x20);
        auVar3._0_8_ = LVar2;
        auVar3._12_4_ = 0x45300000;
        local_38 = (1000.0 / dVar1) *
                   ((auVar3._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)LVar2) - 4503599627370496.0));
        if (1048576.0 < local_38) {
          local_38 = 1048576.0;
        }
        this->scavenge_counter_ = (long)local_38;
      }
    }
    else {
      this->scavenge_counter_ = 0x40000;
    }
  }
  return;
}

Assistant:

void PageHeap::IncrementalScavenge(Length n) {
  ASSERT(lock_.IsHeld());
  // Fast path; not yet time to release memory
  scavenge_counter_ -= n;
  if (scavenge_counter_ >= 0) return;  // Not yet time to scavenge

  const double rate = FLAGS_tcmalloc_release_rate;
  if (rate <= 1e-6) {
    // Tiny release rate means that releasing is disabled.
    scavenge_counter_ = kDefaultReleaseDelay;
    return;
  }

  ++stats_.scavenge_count;

  Length released_pages = ReleaseAtLeastNPages(1);

  if (released_pages == 0) {
    // Nothing to scavenge, delay for a while.
    scavenge_counter_ = kDefaultReleaseDelay;
  } else {
    // Compute how long to wait until we return memory.
    // FLAGS_tcmalloc_release_rate==1 means wait for 1000 pages
    // after releasing one page.
    const double mult = 1000.0 / rate;
    double wait = mult * static_cast<double>(released_pages);
    if (wait > kMaxReleaseDelay) {
      // Avoid overflow and bound to reasonable range.
      wait = kMaxReleaseDelay;
    }
    scavenge_counter_ = static_cast<int64_t>(wait);
  }
}